

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmetaobject.cpp
# Opt level: O0

optional<unsigned_long_long> __thiscall QMetaEnum::keyToValue64(QMetaEnum *this,char *key)

{
  bool bVar1;
  qint32 qVar2;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 uVar3;
  long in_RSI;
  long *in_RDI;
  long in_FS_OFFSET;
  optional<unsigned_long_long> oVar4;
  int i;
  optional<QByteArrayView> scope;
  undefined4 in_stack_ffffffffffffff18;
  uint in_stack_ffffffffffffff1c;
  undefined7 in_stack_ffffffffffffff20;
  undefined1 in_stack_ffffffffffffff27;
  QLatin1String *in_stack_ffffffffffffff28;
  QByteArrayView *in_stack_ffffffffffffff30;
  int index;
  QMetaObject *mo;
  QMetaEnum *in_stack_ffffffffffffff40;
  bool local_b5;
  int local_a0;
  QByteArrayView in_stack_ffffffffffffffb0;
  QByteArrayView in_stack_ffffffffffffffc0;
  QMetaEnum QStack_28;
  _Storage<unsigned_long_long,_true> local_18;
  undefined1 local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if ((*in_RDI == 0) || (in_RSI == 0)) {
    std::optional<unsigned_long_long>::optional((optional<unsigned_long_long> *)&local_18);
    uVar3 = extraout_RDX;
  }
  else {
    memset(&stack0xffffffffffffffc0,0xaa,0x28);
    QLatin1String::QLatin1String
              ((QLatin1String *)in_stack_ffffffffffffff30,(char *)in_stack_ffffffffffffff28);
    QByteArrayView::QByteArrayView<QLatin1String,_true>
              (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
    parse_scope(in_stack_ffffffffffffffb0);
    for (local_a0 = 0; qVar2 = Data::keyCount((Data *)(in_RDI + 1)), local_a0 < qVar2;
        local_a0 = local_a0 + 1) {
      bVar1 = std::optional::operator_cast_to_bool((optional<QByteArrayView> *)0x364bb4);
      if (bVar1) {
        std::optional<QByteArrayView>::operator*((optional<QByteArrayView> *)0x364bc7);
        bVar1 = isScopeMatch(in_stack_ffffffffffffffc0,in_stack_ffffffffffffff40);
        local_b5 = false;
        if (bVar1) goto LAB_00364c01;
      }
      else {
LAB_00364c01:
        in_stack_ffffffffffffff40 = &QStack_28;
        index = (int)((ulong)*in_RDI >> 0x20);
        mo = *(QMetaObject **)(*in_RDI + 0x10);
        Data::data((Data *)(in_RDI + 1));
        stringDataView(mo,index);
        local_b5 = ::operator==((QByteArrayView *)
                                CONCAT17(in_stack_ffffffffffffff27,in_stack_ffffffffffffff20),
                                (QByteArrayView *)
                                CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
      }
      if (local_b5 != false) {
        value_helper<>((QMetaEnum *)CONCAT17(in_stack_ffffffffffffff27,in_stack_ffffffffffffff20),
                       in_stack_ffffffffffffff1c);
        std::optional<unsigned_long_long>::optional<unsigned_long_long,_true>
                  ((optional<unsigned_long_long> *)
                   CONCAT17(in_stack_ffffffffffffff27,in_stack_ffffffffffffff20),
                   (unsigned_long_long *)
                   CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
        uVar3 = extraout_RDX_00;
        goto LAB_00364cbf;
      }
    }
    std::optional<unsigned_long_long>::optional((optional<unsigned_long_long> *)&local_18);
    uVar3 = extraout_RDX_01;
  }
LAB_00364cbf:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  oVar4.super__Optional_base<unsigned_long_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long_long>._9_7_ = (undefined7)((ulong)uVar3 >> 8);
  oVar4.super__Optional_base<unsigned_long_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long_long>._M_engaged = (bool)local_10;
  oVar4.super__Optional_base<unsigned_long_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long_long>._M_payload._M_value = local_18._M_value;
  return (optional<unsigned_long_long>)
         oVar4.super__Optional_base<unsigned_long_long,_true,_true>._M_payload.
         super__Optional_payload_base<unsigned_long_long>;
}

Assistant:

std::optional<quint64> QMetaEnum::keyToValue64(const char *key) const
{
    if (!mobj || !key)
        return std::nullopt;
    const auto [scope, enumKey] = parse_scope(QLatin1StringView(key));
    for (int i = 0; i < int(data.keyCount()); ++i) {
        if ((!scope || isScopeMatch(*scope, this))
            && enumKey == stringDataView(mobj, mobj->d.data[data.data() + 2 * i])) {
            return value_helper(i);
        }
    }
    return std::nullopt;
}